

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall
tonk::Connection::queueAddressAndIdChangeMessage(Connection *this,UDPAddress *peerUDPAddress)

{
  bytes_type addrData;
  int iVar1;
  size_t __n;
  uint8_t data [22];
  undefined1 local_1a8;
  undefined2 local_1a7;
  undefined1 local_1a5;
  undefined2 local_1a4;
  uint32_t local_1a2;
  undefined4 uStack_19e;
  undefined8 uStack_19a;
  
  local_1a8 = -0x80;
  local_1a5 = (undefined1)(this->LocallyAssignedIdForRemoteHost >> 0x10);
  local_1a7 = (undefined2)this->LocallyAssignedIdForRemoteHost;
  local_1a4 = swap_bytes((peerUDPAddress->impl_).data_.v4.sin_port);
  if ((peerUDPAddress->impl_).data_.base.sa_family == 2) {
    __n = 10;
    local_1a2 = (peerUDPAddress->impl_).data_.v6.sin6_flowinfo;
  }
  else {
    _local_1a2 = *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 8);
    uStack_19a = *(undefined8 *)((long)&(peerUDPAddress->impl_).data_ + 0x10);
    __n = 0x16;
  }
  iVar1 = bcmp(this->LastIdAndAddressSent,&stack0xfffffffffffffe58,__n);
  if (iVar1 != 0) {
    SessionOutgoing::QueueControl
              ((SessionOutgoing *)&stack0xfffffffffffffe50,(uint8_t *)&this->Outgoing,
               (size_t)&stack0xfffffffffffffe58);
    Result::~Result((Result *)&stack0xfffffffffffffe50);
    memcpy(this->LastIdAndAddressSent,&stack0xfffffffffffffe58,__n);
  }
  return;
}

Assistant:

void Connection::queueAddressAndIdChangeMessage(const UDPAddress& peerUDPAddress)
{
    try
    {
        uint8_t data[protocol::kMaxClientIdAndAddressBytes];

        data[0] = protocol::ControlChannel_S2C_ClientIdAndAddress;
        siamese::WriteU24_LE(data + 1, LocallyAssignedIdForRemoteHost);
        siamese::WriteU16_LE(data + 1 + 3, peerUDPAddress.port());
        size_t written = 1 + 3 + 2;

        const asio::ip::address ipaddr = peerUDPAddress.address();
        if (ipaddr.is_v4())
        {
            const asio::ip::address_v4 v4addr = ipaddr.to_v4();
            const auto addrData = v4addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv4
        }
        else if (ipaddr.is_v6())
        {
            const asio::ip::address_v6 v6addr = ipaddr.to_v6();
            const auto addrData = v6addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv6
        }
        else
        {
            TONK_DEBUG_BREAK();
            return;
        }

        TONK_DEBUG_ASSERT(written <= protocol::kMaxClientIdAndAddressBytes);

        // Note: Sometimes the same IP:port can be contacted twice in a row
        // from e.g. hostname resolution.  Avoid queuing the same data twice.
        if (0 != memcmp(LastIdAndAddressSent, data, written))
        {
            Outgoing.QueueControl(data, written);
            memcpy(LastIdAndAddressSent, data, written);
        }
    }
    catch (...)
    {
        Logger.Error("queueAddressAndIdChangeMessage: Exception while converting IP address");
    }
}